

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

void __thiscall
tchecker::clock_updates_visitor_t::update_int_to_clock_outside_loop
          (clock_updates_visitor_t *this,typed_lvalue_expression_t *x,
          shared_ptr<const_tchecker::expression_t> *c)

{
  bool bVar1;
  uint *puVar2;
  clock_updates_list_t *pcVar3;
  clock_id_t local_54;
  clock_id_t z_1;
  clock_id_t z;
  undefined1 local_40 [8];
  clock_update_t x_upd;
  range_t<unsigned_int,_unsigned_int> x_instances;
  shared_ptr<const_tchecker::expression_t> *c_local;
  typed_lvalue_expression_t *x_local;
  clock_updates_visitor_t *this_local;
  
  x_upd._value.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extract_lvalue_variable_ids(x)
  ;
  clock_update_t::clock_update_t((clock_update_t *)local_40,0x7fffffff,c);
  bVar1 = single_instance((range_t<unsigned_int,_unsigned_int> *)
                          &x_upd._value.
                           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
  if (bVar1) {
    puVar2 = range_t<unsigned_int,_unsigned_int>::begin
                       ((range_t<unsigned_int,_unsigned_int> *)
                        &x_upd._value.
                         super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
    pcVar3 = clock_updates_map_t::operator[](&this->_u,*puVar2);
    clock_updates_list_t::set(pcVar3,(clock_update_t *)local_40);
  }
  else {
    puVar2 = range_t<unsigned_int,_unsigned_int>::begin
                       ((range_t<unsigned_int,_unsigned_int> *)
                        &x_upd._value.
                         super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
    for (local_54 = *puVar2;
        puVar2 = range_t<unsigned_int,_unsigned_int>::end
                           ((range_t<unsigned_int,_unsigned_int> *)
                            &x_upd._value.
                             super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount), local_54 != *puVar2; local_54 = local_54 + 1) {
      pcVar3 = clock_updates_map_t::operator[](&this->_u,local_54);
      clock_updates_list_t::absorbing_push_back(pcVar3,(clock_update_t *)local_40);
    }
  }
  clock_update_t::~clock_update_t((clock_update_t *)local_40);
  return;
}

Assistant:

void update_int_to_clock_outside_loop(tchecker::typed_lvalue_expression_t const & x,
                                        std::shared_ptr<tchecker::expression_t const> const & c)
  {
    tchecker::range_t<tchecker::variable_id_t> x_instances = tchecker::extract_lvalue_variable_ids(x);
    tchecker::clock_update_t x_upd{tchecker::REFCLOCK_ID, c};
    if (single_instance(x_instances)) {
      tchecker::clock_id_t z = x_instances.begin();
      _u[z].set(x_upd);
    }
    else {
      for (tchecker::clock_id_t z = x_instances.begin(); z != x_instances.end(); ++z)
        _u[z].absorbing_push_back(x_upd);
    }
  }